

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovContext.cpp
# Opt level: O2

void __thiscall
cov::Context::Context(Context *this,Device *device,contextCallback pfnNotify,void *userData)

{
  int iVar1;
  float priority;
  VkDeviceCreateInfo deviceCreateInfo;
  VkDeviceQueueCreateInfo local_48;
  
  ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>::ClObject
            (&this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>);
  this->m_device = device;
  this->m_callback = pfnNotify;
  this->m_userData = userData;
  this->m_vkDevice = (VkDevice)0x0;
  this->m_vkQueue = (VkQueue)0x0;
  deviceCreateInfo.pQueueCreateInfos = &local_48;
  local_48.pNext = (void *)0x0;
  local_48.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
  local_48._4_4_ = 0;
  local_48._16_8_ = (ulong)device->m_vkQueueFamilyIndex << 0x20;
  local_48.queueCount = 1;
  local_48._28_4_ = 0;
  local_48.pQueuePriorities = &priority;
  priority = 1.0;
  deviceCreateInfo.pNext = (void *)0x0;
  deviceCreateInfo.enabledExtensionCount = 0;
  deviceCreateInfo._52_4_ = 0;
  deviceCreateInfo.ppEnabledExtensionNames = (char **)0x0;
  deviceCreateInfo.enabledLayerCount = 0;
  deviceCreateInfo._36_4_ = 0;
  deviceCreateInfo.ppEnabledLayerNames = (char **)0x0;
  deviceCreateInfo.pEnabledFeatures = (VkPhysicalDeviceFeatures *)0x0;
  deviceCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  deviceCreateInfo._4_4_ = 0;
  deviceCreateInfo.flags = 0;
  deviceCreateInfo.queueCreateInfoCount = 1;
  if ((this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess == true) {
    iVar1 = vkCreateDevice(device->m_vkPhysicalDevice,&deviceCreateInfo,0,&this->m_vkDevice);
    (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess = iVar1 == 0;
    if (iVar1 == 0) {
      vkGetDeviceQueue(this->m_vkDevice,this->m_device->m_vkQueueFamilyIndex,0,&this->m_vkQueue);
      return;
    }
    pfnNotify = this->m_callback;
    userData = this->m_userData;
  }
  else {
    (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess = false;
  }
  (*pfnNotify)("failed to create context!",(void *)0x0,0,userData);
  return;
}

Assistant:

Context::Context(const Device& device, contextCallback pfnNotify, void* userData)
    : ClObject(),
      m_device(device),
      m_callback(pfnNotify),
      m_userData(userData),
      m_vkDevice(VK_NULL_HANDLE),
      m_vkQueue(VK_NULL_HANDLE)
{
    VkDeviceQueueCreateInfo queueCreateInfo{};
    queueCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
    queueCreateInfo.queueFamilyIndex = m_device.m_vkQueueFamilyIndex;
    queueCreateInfo.queueCount = 1;
    const float priority = 1.0f;
    queueCreateInfo.pQueuePriorities = &priority;

    VkDeviceCreateInfo deviceCreateInfo{};
    deviceCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
    deviceCreateInfo.queueCreateInfoCount = 1;
    deviceCreateInfo.pQueueCreateInfos = &queueCreateInfo;
    m_initSuccess = m_initSuccess &&
        vkCreateDevice(m_device.m_vkPhysicalDevice, &deviceCreateInfo, nullptr, &m_vkDevice) == VK_SUCCESS;

    if (m_initSuccess) {
        vkGetDeviceQueue(m_vkDevice, m_device.m_vkQueueFamilyIndex, 0, &m_vkQueue);
    } else {
        m_callback("failed to create context!", nullptr, 0, m_userData);
    }
}